

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

shared_ptr<Map_Item> __thiscall
Map::AddItem(Map *this,short id,int amount,uchar x,uchar y,Character *from)

{
  World *pWVar1;
  Character *this_00;
  bool bVar2;
  int iVar3;
  reference psVar4;
  mapped_type *pmVar5;
  element_type *peVar6;
  reference ppCVar7;
  undefined7 in_register_00000009;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  undefined6 in_register_00000032;
  Map *this_01;
  shared_ptr<Map_Item> sVar9;
  Character *in_stack_00000008;
  Character *character;
  iterator __end1;
  iterator __begin1;
  list<Character_*,_std::allocator<Character_*>_> *__range1;
  PacketBuilder builder;
  key_type local_b8;
  allocator<char> local_91;
  key_type local_90;
  undefined1 local_70 [8];
  shared_ptr<Map_Item> item;
  iterator __end2;
  iterator __begin2;
  list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *__range2;
  int local_40;
  int onmap;
  int ontile;
  int local_2c;
  short local_28 [2];
  byte local_23;
  byte local_22;
  byte local_21;
  int local_20;
  uchar y_local;
  uchar x_local;
  int amount_local;
  short id_local;
  Map *this_local;
  shared_ptr<Map_Item> *newitem;
  
  this_01 = (Map *)CONCAT62(in_register_00000032,id);
  local_20 = (int)CONCAT71(in_register_00000009,x);
  local_22 = (byte)from;
  _y_local = (short)amount;
  local_23 = 0;
  local_28[0] = 0;
  local_28[1] = 0;
  local_2c = 0;
  local_21 = y;
  _amount_local = this_01;
  this_local = this;
  std::make_shared<Map_Item,int,short&,int&,unsigned_char&,unsigned_char&,int,int>
            ((int *)this,local_28,(int *)&y_local,(uchar *)&local_20,&local_21,(int *)&local_22,
             &local_2c);
  if (in_stack_00000008 != (Character *)0x0) {
    local_40 = 0;
    __range2._4_4_ = 0;
    __end2 = std::__cxx11::
             list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::begin
                       (&this_01->items);
    item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::__cxx11::list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
         ::end(&this_01->items);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&item.
                                                  super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount), bVar2) {
      psVar4 = std::_List_iterator<std::shared_ptr<Map_Item>_>::operator*(&__end2);
      std::shared_ptr<Map_Item>::shared_ptr((shared_ptr<Map_Item> *)local_70,psVar4);
      __range2._4_4_ = __range2._4_4_ + 1;
      peVar6 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )local_70);
      if ((peVar6->x == local_21) &&
         (peVar6 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_70), peVar6->y == local_22)) {
        local_40 = local_40 + 1;
      }
      std::shared_ptr<Map_Item>::~shared_ptr((shared_ptr<Map_Item> *)local_70);
      std::_List_iterator<std::shared_ptr<Map_Item>_>::operator++(&__end2);
    }
    pWVar1 = this_01->world;
    std::allocator<char>::allocator();
    builder.add_size._6_1_ = 0;
    builder.add_size._5_1_ = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"MaxTile",&local_91);
    pmVar5 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(pWVar1->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,&local_90);
    iVar3 = util::variant::operator_cast_to_int(pmVar5);
    bVar2 = true;
    if (local_40 < iVar3) {
      pWVar1 = this_01->world;
      std::allocator<char>::allocator();
      builder.add_size._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"MaxMap",(allocator<char> *)((long)&builder.add_size + 7));
      builder.add_size._5_1_ = 1;
      pmVar5 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
               ::operator[](&(pWVar1->config).
                             super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                            ,&local_b8);
      iVar3 = util::variant::operator_cast_to_int(pmVar5);
      bVar2 = iVar3 <= __range2._4_4_;
    }
    if ((builder.add_size._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_b8);
    }
    if ((builder.add_size._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&builder.add_size + 7));
    }
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    if (bVar2) {
      local_23 = 1;
      builder.add_size._0_4_ = 1;
      _Var8._M_pi = extraout_RDX;
      goto LAB_001e0ed3;
    }
  }
  iVar3 = GenerateItemID(this_01);
  peVar6 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  peVar6->uid = (short)iVar3;
  PacketBuilder::PacketBuilder((PacketBuilder *)&__range1,PACKET_ITEM,PACKET_ADD,9);
  PacketBuilder::AddShort((PacketBuilder *)&__range1,(int)_y_local);
  peVar6 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  PacketBuilder::AddShort((PacketBuilder *)&__range1,(int)peVar6->uid);
  PacketBuilder::AddThree((PacketBuilder *)&__range1,local_20);
  PacketBuilder::AddChar((PacketBuilder *)&__range1,(uint)local_21);
  PacketBuilder::AddChar((PacketBuilder *)&__range1,(uint)local_22);
  __end1 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin
                     (&this_01->characters);
  character = (Character *)
              std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end
                        (&this_01->characters);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&character), bVar2) {
    ppCVar7 = std::_List_iterator<Character_*>::operator*(&__end1);
    this_00 = *ppCVar7;
    if ((in_stack_00000008 == (Character *)0x0) || (this_00 != in_stack_00000008)) {
      peVar6 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         this);
      bVar2 = Character::InRange(this_00,peVar6);
      if (bVar2) {
        Character::Send(this_00,(PacketBuilder *)&__range1);
      }
    }
    std::_List_iterator<Character_*>::operator++(&__end1);
  }
  std::__cxx11::list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::
  push_back(&this_01->items,(value_type *)this);
  local_23 = 1;
  builder.add_size._0_4_ = 1;
  PacketBuilder::~PacketBuilder((PacketBuilder *)&__range1);
  _Var8._M_pi = extraout_RDX_00;
LAB_001e0ed3:
  if ((local_23 & 1) == 0) {
    std::shared_ptr<Map_Item>::~shared_ptr((shared_ptr<Map_Item> *)this);
    _Var8._M_pi = extraout_RDX_01;
  }
  sVar9.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var8._M_pi;
  sVar9.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Map_Item>)sVar9.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Map_Item> Map::AddItem(short id, int amount, unsigned char x, unsigned char y, Character *from)
{
	std::shared_ptr<Map_Item> newitem(std::make_shared<Map_Item>(0, id, amount, x, y, 0, 0));

	if (from || (from && from->SourceAccess() <= ADMIN_GM))
	{
		int ontile = 0;
		int onmap = 0;

		UTIL_FOREACH(this->items, item)
		{
			++onmap;
			if (item->x == x && item->y == y)
			{
				++ontile;
			}
		}

		if (ontile >= static_cast<int>(this->world->config["MaxTile"]) || onmap >= static_cast<int>(this->world->config["MaxMap"]))
		{
			return newitem;
		}
	}

	newitem->uid = GenerateItemID();

	PacketBuilder builder(PACKET_ITEM, PACKET_ADD, 9);
	builder.AddShort(id);
	builder.AddShort(newitem->uid);
	builder.AddThree(amount);
	builder.AddChar(x);
	builder.AddChar(y);

	UTIL_FOREACH(this->characters, character)
	{
		if ((from && character == from) || !character->InRange(*newitem))
		{
			continue;
		}

		character->Send(builder);
	}

	this->items.push_back(newitem);
	return newitem;
}